

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O0

void __thiscall
andres::View<TestType,false,std::allocator<unsigned_long>>::
indexToCoordinates<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
          (View<TestType,false,std::allocator<unsigned_long>> *this,size_t index,
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          outit)

{
  size_t sVar1;
  CoordinateOrder *pCVar2;
  reference puVar3;
  size_t local_30;
  size_t j_1;
  size_t j;
  size_t index_local;
  View<TestType,_false,_std::allocator<unsigned_long>_> *this_local;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  outit_local;
  
  this_local = (View<TestType,_false,_std::allocator<unsigned_long>_> *)outit._M_current;
  View<TestType,_false,_std::allocator<unsigned_long>_>::testInvariant
            ((View<TestType,_false,_std::allocator<unsigned_long>_> *)this);
  sVar1 = View<TestType,_false,_std::allocator<unsigned_long>_>::dimension
                    ((View<TestType,_false,_std::allocator<unsigned_long>_> *)this);
  marray_detail::Assert<bool>(sVar1 != 0);
  sVar1 = View<TestType,_false,_std::allocator<unsigned_long>_>::size
                    ((View<TestType,_false,_std::allocator<unsigned_long>_> *)this);
  marray_detail::Assert<bool>(index < sVar1);
  pCVar2 = View<TestType,_false,_std::allocator<unsigned_long>_>::coordinateOrder
                     ((View<TestType,_false,_std::allocator<unsigned_long>_> *)this);
  j = index;
  if (*pCVar2 == FirstMajorOrder) {
    j_1 = 0;
    while (sVar1 = View<TestType,_false,_std::allocator<unsigned_long>_>::dimension
                             ((View<TestType,_false,_std::allocator<unsigned_long>_> *)this),
          j_1 < sVar1) {
      sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                        ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),j_1);
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&this_local);
      *puVar3 = j / sVar1;
      sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                        ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),j_1);
      j = j % sVar1;
      j_1 = j_1 + 1;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator++((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&this_local);
    }
  }
  else {
    local_30 = View<TestType,_false,_std::allocator<unsigned_long>_>::dimension
                         ((View<TestType,_false,_std::allocator<unsigned_long>_> *)this);
    local_30 = local_30 - 1;
    __gnu_cxx::
    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::operator+=((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                  *)&this_local,local_30);
    while( true ) {
      sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                        ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_30);
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
               ::operator*((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)&this_local);
      *puVar3 = j / sVar1;
      sVar1 = marray_detail::Geometry<std::allocator<unsigned_long>_>::shapeStrides
                        ((Geometry<std::allocator<unsigned_long>_> *)(this + 8),local_30);
      j = j % sVar1;
      if (local_30 == 0) break;
      __gnu_cxx::
      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
      ::operator--((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    *)&this_local);
      local_30 = local_30 - 1;
    }
  }
  return;
}

Assistant:

inline void
View<T, isConst, A>::indexToCoordinates
(
    std::size_t index, // copy to work on
    CoordinateIterator outit
) const
{
    testInvariant();
    marray_detail::Assert(MARRAY_NO_DEBUG || this->dimension() > 0);
    marray_detail::Assert(MARRAY_NO_ARG_TEST || index < this->size());
    if(coordinateOrder() == FirstMajorOrder) {
        for(std::size_t j=0; j<this->dimension(); ++j, ++outit) {
            *outit = std::size_t(index / geometry_.shapeStrides(j));
            index = index % geometry_.shapeStrides(j);
        }
    }
    else { // last major order
        std::size_t j = this->dimension()-1;
        outit += j;
        for(;;) {
            *outit = std::size_t(index / geometry_.shapeStrides(j));
            index = index % geometry_.shapeStrides(j);
            if(j == 0) {
                break;
            }
            else {
                --outit;
                --j;
            }
        }
    }
}